

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

QLayoutItem * __thiscall QToolBarAreaLayout::plug(QToolBarAreaLayout *this,QList<int> *path)

{
  int **debug;
  QToolBarAreaLayoutItem *pQVar1;
  QDebug *pQVar2;
  QLayoutItem *pQVar3;
  long in_FS_OFFSET;
  QDebug local_40;
  QList<int> local_38;
  
  local_38.d.size = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = item(this,path);
  if (pQVar1 == (QToolBarAreaLayoutItem *)0x0) {
    QMessageLogger::warning();
    pQVar2 = QDebug::operator<<(&local_40,"No item at");
    local_38.d.d = (Data *)pQVar2->stream;
    *(int *)((long)local_38.d.d + 0x28) = *(int *)((long)local_38.d.d + 0x28) + 1;
    debug = &local_38.d.ptr;
    ::operator<<((QDebug)debug,&local_38);
    QDebug::~QDebug((QDebug *)debug);
    QDebug::~QDebug((QDebug *)&local_38);
    QDebug::~QDebug(&local_40);
    pQVar3 = (QLayoutItem *)0x0;
  }
  else {
    pQVar1->gap = false;
    pQVar3 = pQVar1->widgetItem;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38.d.size) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QToolBarAreaLayout::plug(const QList<int> &path)
{
    QToolBarAreaLayoutItem *item = this->item(path);
    if (Q_UNLIKELY(!item)) {
        qWarning() << "No item at" << path;
        return nullptr;
    }
    Q_ASSERT(item->gap);
    Q_ASSERT(item->widgetItem != nullptr);
    item->gap = false;
    return item->widgetItem;
}